

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_menu_begin(nk_context *ctx,nk_window *win,char *id,int is_clicked,nk_rect header,nk_vec2 size
                 )

{
  nk_window *pnVar1;
  int iVar2;
  nk_hash nVar3;
  int iVar4;
  bool bVar5;
  nk_rect body;
  
  iVar2 = nk_strlen(id);
  nVar3 = nk_murmur_hash(id,iVar2,0x40);
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x43d6,
                  "int nk_menu_begin(struct nk_context *, struct nk_window *, const char *, int, struct nk_rect, struct nk_vec2)"
                 );
  }
  if (ctx->current->layout != (nk_panel *)0x0) {
    pnVar1 = (win->popup).win;
    if ((pnVar1 == (nk_window *)0x0) || ((win->popup).name != nVar3)) {
      bVar5 = false;
    }
    else {
      bVar5 = (win->popup).type == NK_PANEL_MENU;
    }
    iVar2 = 0;
    if ((is_clicked != 0 || pnVar1 != (nk_window *)0x0) &&
       (iVar2 = 0, (bool)(pnVar1 == (nk_window *)0x0 | bVar5))) {
      body.y = header.y + header.h;
      body.x = header.x;
      body._8_8_ = size;
      iVar4 = nk_nonblock_begin(ctx,0x20,body,header,NK_PANEL_MENU);
      if (iVar4 != 0) {
        (win->popup).type = NK_PANEL_MENU;
        (win->popup).name = nVar3;
        iVar2 = 1;
      }
    }
    return iVar2;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x43d7,
                "int nk_menu_begin(struct nk_context *, struct nk_window *, const char *, int, struct nk_rect, struct nk_vec2)"
               );
}

Assistant:

NK_INTERN int
nk_menu_begin(struct nk_context *ctx, struct nk_window *win,
    const char *id, int is_clicked, struct nk_rect header, struct nk_vec2 size)
{
    int is_open = 0;
    int is_active = 0;
    struct nk_rect body;
    struct nk_window *popup;
    nk_hash hash = nk_murmur_hash(id, (int)nk_strlen(id), NK_PANEL_MENU);

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    body.x = header.x;
    body.w = size.x;
    body.y = header.y + header.h;
    body.h = size.y;

    popup = win->popup.win;
    is_open = popup ? nk_true : nk_false;
    is_active = (popup && (win->popup.name == hash) && win->popup.type == NK_PANEL_MENU);
    if ((is_clicked && is_open && !is_active) || (is_open && !is_active) ||
        (!is_open && !is_active && !is_clicked)) return 0;
    if (!nk_nonblock_begin(ctx, NK_WINDOW_NO_SCROLLBAR, body, header, NK_PANEL_MENU))
        return 0;

    win->popup.type = NK_PANEL_MENU;
    win->popup.name = hash;
    return 1;
}